

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O3

bool chrono::utils::AddTriangleMeshConvexDecompositionV2
               (ChBody *body,shared_ptr<chrono::ChMaterialSurface> *material,string *obj_filename,
               string *name,ChVector<double> *pos,ChQuaternion<double> *rot,bool use_original_asset,
               shared_ptr<chrono::ChVisualMaterial> *vis_material)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  _func_int *p_Var5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  ChVisualModel *pCVar12;
  undefined8 uVar13;
  uint uVar14;
  int iVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  _func_int **pp_Var17;
  ostream *this;
  ChTriangleMeshShape *pCVar18;
  long lVar19;
  byte bVar20;
  ulong uVar21;
  pointer *size;
  size_t size_00;
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  shared_ptr<chrono::ChTriangleMeshShape> trimesh_shape;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh;
  shared_ptr<chrono::ChTriangleMeshShape> trimesh_shape_1;
  ChConvexDecompositionHACDv2 mydecompositionHACDv2;
  stringstream ss;
  ChVisualModel *local_3f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_3f0;
  long local_3e8;
  ChTriangleMeshShape *local_3d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_3d0 [2];
  uint local_3c0;
  uint local_3bc;
  undefined1 local_3b8 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_390;
  pointer pCStack_388;
  pointer local_380;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> local_378;
  shared_ptr<chrono::ChVisualModel> local_368;
  shared_ptr<chrono::ChVisualShape> local_358;
  shared_ptr<chrono::ChVisualMaterial> local_348;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> local_338;
  shared_ptr<chrono::ChVisualShape> local_328;
  shared_ptr<chrono::ChVisualMaterial> local_318;
  pointer local_308;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_300;
  undefined **local_2f0;
  _func_int **local_2e8;
  _func_int **local_2e0;
  _Alloc_hider local_2d8;
  ChVisualModel *local_2d0;
  undefined1 local_2c8 [8];
  ChFrame<double> local_2c0;
  ChConvexDecompositionHACDv2 local_238;
  undefined1 local_1b8 [16];
  double dStack_1a8;
  double local_1a0;
  double local_198;
  double local_190;
  double dStack_188;
  double local_180;
  undefined1 local_178 [328];
  
  local_3b8._24_8_ = name;
  local_2d8._M_p = (pointer)material;
  ChPhysicsItem::GetVisualModel(&body->super_ChPhysicsItem);
  uVar13 = local_1b8._0_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
  }
  if ((_func_int **)uVar13 == (_func_int **)0x0) {
    p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x40);
    p_Var16->_M_use_count = 1;
    p_Var16->_M_weak_count = 1;
    local_368.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(p_Var16 + 1);
    p_Var16->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b0bf68;
    p_Var16[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var16[1]._M_use_count = 0;
    p_Var16[1]._M_weak_count = 0;
    p_Var16[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var16[2]._M_use_count = 0;
    p_Var16[2]._M_weak_count = 0;
    p_Var16[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var16[2]._M_use_count = 0;
    p_Var16[2]._M_weak_count = 0;
    p_Var16[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var16[3]._M_use_count = 0;
    p_Var16[3]._M_weak_count = 0;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var16->_M_use_count = 2;
    }
    local_368.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var16;
    ChPhysicsItem::AddVisualModel(&body->super_ChPhysicsItem,&local_368);
    if (local_368.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_368.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
  }
  bVar20 = 0;
  geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
            ((ChTriangleMeshConnected *)local_3b8,obj_filename,true,false);
  if ((_func_int **)local_3b8._0_8_ != (_func_int **)0x0) {
    pp_Var17 = (((ChTriangleMesh *)(local_3b8._0_8_ + 8))->super_ChGeometry)._vptr_ChGeometry;
    lVar19 = (long)(((ChTriangleMesh *)(local_3b8._0_8_ + 0x10))->super_ChGeometry)._vptr_ChGeometry
             - (long)pp_Var17;
    if (lVar19 != 0) {
      auVar23 = ZEXT816(0xbff0000000000000);
      auVar24 = ZEXT816(0x4000000000000000);
      lVar19 = (lVar19 >> 3) * -0x5555555555555555;
      lVar19 = lVar19 + (ulong)(lVar19 == 0);
      pp_Var17 = pp_Var17 + 2;
      do {
        dVar1 = rot->m_data[0];
        dVar2 = rot->m_data[2];
        dVar3 = rot->m_data[1];
        dVar4 = rot->m_data[3];
        p_Var5 = pp_Var17[-1];
        auVar35._8_8_ = 0;
        auVar35._0_8_ = pp_Var17[-2];
        auVar36._8_8_ = 0;
        auVar36._0_8_ = *pp_Var17;
        dVar9 = dVar1 * dVar1;
        dVar10 = dVar3 * dVar2 - dVar4 * dVar1;
        dVar8 = dVar3 * dVar2 + dVar4 * dVar1;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = dVar9 + dVar2 * dVar2;
        auVar30 = vfmadd213sd_fma(auVar32,auVar24,auVar23);
        auVar29._8_8_ = 0;
        auVar29._0_8_ = dVar9 + dVar3 * dVar3;
        auVar26 = vfmadd213sd_fma(auVar29,auVar24,auVar23);
        auVar34._8_8_ = 0;
        auVar34._0_8_ = (double)p_Var5 * (dVar10 + dVar10);
        auVar26 = vfmadd231sd_fma(auVar34,auVar35,auVar26);
        dVar10 = dVar1 * dVar2 + dVar4 * dVar3;
        dVar11 = dVar4 * dVar3 - dVar1 * dVar2;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = dVar8 + dVar8;
        auVar33._8_8_ = 0;
        auVar33._0_8_ = (double)p_Var5 * auVar30._0_8_;
        auVar25 = vfmadd231sd_fma(auVar33,auVar35,auVar25);
        dVar8 = dVar4 * dVar2 - dVar1 * dVar3;
        dVar2 = dVar1 * dVar3 + dVar4 * dVar2;
        auVar30._8_8_ = 0;
        auVar30._0_8_ = dVar10 + dVar10;
        auVar30 = vfmadd213sd_fma(auVar30,auVar36,auVar26);
        auVar26._8_8_ = 0;
        auVar26._0_8_ = dVar8 + dVar8;
        auVar26 = vfmadd213sd_fma(auVar26,auVar36,auVar25);
        dVar1 = pos->m_data[1];
        auVar27._8_8_ = 0;
        auVar27._0_8_ = dVar11 + dVar11;
        auVar31._8_8_ = 0;
        auVar31._0_8_ = (double)p_Var5 * (dVar2 + dVar2);
        auVar27 = vfmadd231sd_fma(auVar31,auVar35,auVar27);
        auVar28._8_8_ = 0;
        auVar28._0_8_ = dVar4 * dVar4 + dVar9;
        auVar25 = vfmadd213sd_fma(auVar28,auVar24,auVar23);
        auVar25 = vfmadd213sd_fma(auVar25,auVar36,auVar27);
        dVar2 = pos->m_data[2];
        pp_Var17[-2] = (_func_int *)(auVar30._0_8_ + pos->m_data[0]);
        pp_Var17[-1] = (_func_int *)(auVar26._0_8_ + dVar1);
        *pp_Var17 = (_func_int *)(auVar25._0_8_ + dVar2);
        pp_Var17 = pp_Var17 + 3;
        lVar19 = lVar19 + -1;
      } while (lVar19 != 0);
    }
    collision::ChConvexDecompositionHACDv2::ChConvexDecompositionHACDv2(&local_238);
    collision::ChConvexDecompositionHACDv2::Reset(&local_238);
    collision::ChConvexDecompositionHACDv2::AddTriangleMesh
              (&local_238,(ChTriangleMesh *)local_3b8._0_8_);
    size = (pointer *)0x400;
    collision::ChConvexDecompositionHACDv2::SetParameters
              (&local_238,0x400,0x100,0x40,0.01,0.0,1e-06);
    collision::ChConvexDecompositionHACDv2::ComputeConvexDecomposition(&local_238);
    uVar14 = (*local_238.super_ChConvexDecomposition._vptr_ChConvexDecomposition[7])();
    if ((int)uVar14 < 1) {
      uVar21 = 1;
    }
    else {
      uVar21 = 0;
      size_00 = 0;
      local_2e0 = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b3ebb8;
      local_2e8 = (_func_int **)&PTR__ChTriangleMeshConnected_00b3eaa8;
      local_2f0 = &PTR__ChFrame_00b03780;
      local_3bc = uVar14;
      do {
        local_3e8 = 0;
        local_3f8 = (ChVisualModel *)0x0;
        p_Stack_3f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        iVar22 = (int)size_00;
        iVar15 = (*local_238.super_ChConvexDecomposition._vptr_ChConvexDecomposition[9])
                           (&local_238,size_00,&local_3f8);
        if ((char)iVar15 == '\0') {
LAB_00911c68:
          bVar20 = (byte)uVar21;
          if (local_3f8 != (ChVisualModel *)0x0) {
            operator_delete(local_3f8,local_3e8 - (long)local_3f8);
          }
          goto LAB_00911dfa;
        }
        local_3c0 = (uint)uVar21;
        peVar6 = (body->collision_model).
                 super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        p_Var16 = (body->collision_model).
                  super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
        if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
          }
        }
        local_308 = *(pointer *)local_2d8._M_p;
        p_Stack_300 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d8._M_p + 8))->_M_pi;
        p_Var7 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d8._M_p + 8))->_M_pi;
        if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          }
        }
        ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)local_1b8,rot);
        size = &local_308;
        (*peVar6->_vptr_ChCollisionModel[0xf])
                  (peVar6,size,&local_3f8,pos,(ChMatrix33<double> *)local_1b8);
        if (p_Stack_300 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_300);
        }
        if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
        }
        if (!use_original_asset) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          this = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&dStack_1a8,((_Alloc_hider *)local_3b8._24_8_)->_M_p,
                            *(size_type *)(local_3b8._24_8_ + 8));
          std::__ostream_insert<char,std::char_traits<char>>(this,"_",1);
          std::ostream::operator<<(this,iVar22);
          p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x110);
          p_Var16->_M_use_count = 1;
          p_Var16->_M_weak_count = 1;
          p_Var16->_vptr__Sp_counted_base = local_2e0;
          p_Var16[1]._vptr__Sp_counted_base = local_2e8;
          p_Var16[9]._M_use_count = 0;
          p_Var16[9]._M_weak_count = 0;
          p_Var16[10]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var16[10]._M_use_count = 0;
          p_Var16[10]._M_weak_count = 0;
          p_Var16[0xb]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var16[0xb]._M_use_count = 0;
          p_Var16[0xb]._M_weak_count = 0;
          p_Var16[0xc]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var16[0xc]._M_use_count = 0;
          p_Var16[0xc]._M_weak_count = 0;
          p_Var16[0xd]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var16[1]._M_use_count = 0;
          p_Var16[1]._M_weak_count = 0;
          p_Var16[2]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var16[2]._M_use_count = 0;
          p_Var16[2]._M_weak_count = 0;
          p_Var16[3]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var16[3]._M_use_count = 0;
          p_Var16[3]._M_weak_count = 0;
          p_Var16[4]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var16[4]._M_use_count = 0;
          p_Var16[4]._M_weak_count = 0;
          p_Var16[5]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var16[5]._M_use_count = 0;
          p_Var16[5]._M_weak_count = 0;
          p_Var16[6]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var16[6]._M_use_count = 0;
          p_Var16[6]._M_weak_count = 0;
          p_Var16[7]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var16[7]._M_use_count = 0;
          p_Var16[7]._M_weak_count = 0;
          p_Var16[8]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var16[8]._M_use_count = 0;
          p_Var16[8]._M_weak_count = 0;
          p_Var16[9]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var16[0xb]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var16[0xb]._M_use_count = 0;
          p_Var16[0xb]._M_weak_count = 0;
          p_Var16[0xc]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var16[0xc]._M_use_count = 0;
          p_Var16[0xc]._M_weak_count = 0;
          p_Var16[0xd]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var16[0xd]._M_use_count = 0;
          p_Var16[0xd]._M_weak_count = 0;
          p_Var16[0xe]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var16[0xe]._M_use_count = 0;
          p_Var16[0xe]._M_weak_count = 0;
          p_Var16[0xf]._vptr__Sp_counted_base = (_func_int **)(p_Var16 + 0x10);
          p_Var16[0xf]._M_use_count = 0;
          p_Var16[0xf]._M_weak_count = 0;
          *(undefined1 *)&p_Var16[0x10]._vptr__Sp_counted_base = 0;
          iVar15 = (*local_238.super_ChConvexDecomposition._vptr_ChConvexDecomposition[8])
                             (&local_238,size_00,(element_type *)(p_Var16 + 1));
          if ((char)iVar15 == '\0') {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
            std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
            std::ios_base::~ios_base((ios_base *)(local_178 + 0x40));
            uVar21 = (ulong)local_3c0;
            goto LAB_00911c68;
          }
          pCVar18 = (ChTriangleMeshShape *)
                    ChVisualShape::operator_new((ChVisualShape *)0x98,size_00);
          ChTriangleMeshShape::ChTriangleMeshShape(pCVar18);
          local_3d8 = pCVar18;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<chrono::ChTriangleMeshShape*>(a_Stack_3d0,pCVar18);
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
          }
          local_378.
          super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)(p_Var16 + 1);
          local_378.
          super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = p_Var16;
          ChTriangleMeshShape::SetMesh(local_3d8,&local_378,true);
          if (local_378.
              super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_378.
                       super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          pCVar18 = local_3d8;
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::_M_assign((string *)&pCVar18->name);
          if (local_2c0._vptr_ChFrame != (_func_int **)(local_2c0.coord.pos.m_data + 1)) {
            operator_delete(local_2c0._vptr_ChFrame,(long)local_2c0.coord.pos.m_data[1] + 1);
          }
          local_318.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (vis_material->
                 super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_318.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (vis_material->
               super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
               ._M_pi;
          p_Var7 = (vis_material->
                   super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
            }
          }
          ChVisualShape::AddMaterial(&local_3d8->super_ChVisualShape,&local_318);
          if (local_318.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_318.
                       super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          ChPhysicsItem::GetVisualModel(&body->super_ChPhysicsItem);
          pCVar12 = local_2d0;
          local_328.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               &local_3d8->super_ChVisualShape;
          local_328.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = a_Stack_3d0[0]._M_pi;
          if (a_Stack_3d0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (a_Stack_3d0[0]._M_pi)->_M_use_count = (a_Stack_3d0[0]._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (a_Stack_3d0[0]._M_pi)->_M_use_count = (a_Stack_3d0[0]._M_pi)->_M_use_count + 1;
            }
          }
          local_3b8._32_8_ = (ChTriangleMeshShape *)0x3ff0000000000000;
          local_380 = (pointer)0x0;
          _Stack_390._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          pCStack_388 = (pointer)0x0;
          local_2c0._vptr_ChFrame = (_func_int **)local_2f0;
          local_2c0.coord.pos.m_data[2] = 0.0;
          local_2c0.coord.pos.m_data[0] = 0.0;
          local_2c0.coord.pos.m_data[1] = 0.0;
          local_2c0.coord.rot.m_data[0] = 1.0;
          local_2c0.coord.rot.m_data[3] = 0.0;
          local_2c0.coord.rot.m_data[1] = 0.0;
          local_2c0.coord.rot.m_data[2] = 0.0;
          ChMatrix33<double>::ChMatrix33
                    (&local_2c0.Amatrix,(ChQuaternion<double> *)(local_3b8 + 0x20));
          ChVisualModel::AddShape(pCVar12,&local_328,(ChFrame<double> *)(local_2c8 + 8));
          if (local_328.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_328.
                       super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_2c8 != (undefined1  [8])0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8);
          }
          if (a_Stack_3d0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_3d0[0]._M_pi);
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
          size = (pointer *)&std::__cxx11::stringstream::VTT;
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base((ios_base *)(local_178 + 0x40));
        }
        if (local_3f8 != (ChVisualModel *)0x0) {
          size = (pointer *)(local_3e8 - (long)local_3f8);
          operator_delete(local_3f8,(ulong)size);
        }
        uVar14 = iVar22 + 1;
        size_00 = (size_t)uVar14;
        uVar21 = CONCAT71((int7)((ulong)p_Var16 >> 8),(int)local_3bc <= (int)uVar14);
      } while (uVar14 != local_3bc);
    }
    bVar20 = (byte)uVar21;
    if (use_original_asset) {
      pCVar18 = (ChTriangleMeshShape *)
                ChVisualShape::operator_new((ChVisualShape *)0x98,(size_t)size);
      ChTriangleMeshShape::ChTriangleMeshShape(pCVar18);
      local_3b8._32_8_ = pCVar18;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChTriangleMeshShape*>
                (&_Stack_390,pCVar18);
      local_338.
      super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_3b8._0_8_;
      local_338.
      super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_3b8._8_8_ + 8) = *(_Atomic_word *)(local_3b8._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_3b8._8_8_ + 8) = *(_Atomic_word *)(local_3b8._8_8_ + 8) + 1;
        }
      }
      ChTriangleMeshShape::SetMesh((ChTriangleMeshShape *)local_3b8._32_8_,&local_338,true);
      if (local_338.
          super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_338.
                   super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      std::__cxx11::string::_M_assign((string *)(local_3b8._32_8_ + 0x40));
      local_348.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (vis_material->super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
      local_348.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (vis_material->
               super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
               ._M_pi;
      p_Var16 = (vis_material->
                super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
        }
      }
      ChVisualShape::AddMaterial((ChVisualShape *)local_3b8._32_8_,&local_348);
      if (local_348.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_348.
                   super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      ChPhysicsItem::GetVisualModel(&body->super_ChPhysicsItem);
      pCVar12 = local_3f8;
      local_358.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_3b8._32_8_;
      local_358.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = _Stack_390._M_pi;
      if (_Stack_390._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (_Stack_390._M_pi)->_M_use_count = (_Stack_390._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (_Stack_390._M_pi)->_M_use_count = (_Stack_390._M_pi)->_M_use_count + 1;
        }
      }
      local_2c0._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
      local_2c0.coord.pos.m_data[0] = 0.0;
      local_2c0.coord.pos.m_data[1] = 0.0;
      local_2c0.coord.pos.m_data[2] = 0.0;
      local_1b8._0_8_ = &PTR__ChFrame_00b03780;
      local_1b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      dStack_1a8 = 0.0;
      local_1a0 = 0.0;
      local_198 = 1.0;
      local_190 = 0.0;
      dStack_188 = 0.0;
      local_180 = 0.0;
      ChMatrix33<double>::ChMatrix33
                ((ChMatrix33<double> *)local_178,(ChQuaternion<double> *)(local_2c8 + 8));
      ChVisualModel::AddShape(pCVar12,&local_358,(ChFrame<double> *)local_1b8);
      if (local_358.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_358.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (p_Stack_3f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_3f0);
      }
      if (_Stack_390._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_390._M_pi);
      }
    }
LAB_00911dfa:
    collision::ChConvexDecompositionHACDv2::~ChConvexDecompositionHACDv2(&local_238);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_);
  }
  return (bool)(bVar20 & 1);
}

Assistant:

bool AddTriangleMeshConvexDecompositionV2(ChBody* body,
                                          std::shared_ptr<ChMaterialSurface> material,
                                          const std::string& obj_filename,
                                          const std::string& name,
                                          const ChVector<>& pos,
                                          const ChQuaternion<>& rot,
                                          bool use_original_asset,
                                          std::shared_ptr<ChVisualMaterial> vis_material) {
    if (!body->GetVisualModel()) {
        auto model = chrono_types::make_shared<ChVisualModel>();
        body->AddVisualModel(model);
    }

    auto trimesh = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(obj_filename, true, false);
    if (!trimesh)
        return false;

    for (int i = 0; i < trimesh->m_vertices.size(); i++) {
        trimesh->m_vertices[i] = pos + rot.Rotate(trimesh->m_vertices[i]);
    }
    collision::ChConvexDecompositionHACDv2 mydecompositionHACDv2;

    int hacd_maxhullcount = 1024;
    int hacd_maxhullmerge = 256;
    int hacd_maxhullvertexes = 64;
    double hacd_concavity = 0.01;
    double hacd_smallclusterthreshold = 0.0;
    double hacd_fusetolerance = 1e-6;

    mydecompositionHACDv2.Reset();
    mydecompositionHACDv2.AddTriangleMesh(*trimesh);

    mydecompositionHACDv2.SetParameters(hacd_maxhullcount, hacd_maxhullmerge, hacd_maxhullvertexes,
                                        (float)hacd_concavity, (float)hacd_smallclusterthreshold,
                                        (float)hacd_fusetolerance);
    mydecompositionHACDv2.ComputeConvexDecomposition();
    collision::ChConvexDecomposition* used_decomposition = &mydecompositionHACDv2;

    int hull_count = used_decomposition->GetHullCount();

    for (int c = 0; c < hull_count; c++) {
        std::vector<ChVector<double>> convexhull;
        if (!used_decomposition->GetConvexHullResult(c, convexhull))
            return false;

        body->GetCollisionModel()->AddConvexHull(material, convexhull, pos, rot);
        if (!use_original_asset) {
            std::stringstream ss;
            ss << name << "_" << c;
            auto trimesh_convex = chrono_types::make_shared<geometry::ChTriangleMeshConnected>();
            if (!used_decomposition->GetConvexHullResult(c, *trimesh_convex))
                return false;

            auto trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
            trimesh_shape->SetMesh(trimesh_convex);
            trimesh_shape->SetName(ss.str());
            trimesh_shape->AddMaterial(vis_material);
            body->GetVisualModel()->AddShape(trimesh_shape, ChFrame<>());
        }
    }
    if (use_original_asset) {
        auto trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
        trimesh_shape->SetMesh(trimesh);
        trimesh_shape->SetName(name);
        trimesh_shape->AddMaterial(vis_material);
        body->GetVisualModel()->AddShape(trimesh_shape, ChFrame<>());
    }

    return true;
}